

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O2

int32_t unorm2_getRawDecomposition_63
                  (UNormalizer2 *norm2,UChar32 c,UChar *decomposition,int32_t capacity,
                  UErrorCode *pErrorCode)

{
  char cVar1;
  int32_t iVar2;
  Char16Ptr local_88;
  UChar *local_80;
  UnicodeString destString;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  if (decomposition == (UChar *)0x0) {
    if (capacity != 0) goto LAB_0027cd39;
  }
  else if (capacity < 0) {
LAB_0027cd39:
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  icu_63::UnicodeString::UnicodeString(&destString,decomposition,0,capacity);
  cVar1 = (**(code **)(*(long *)norm2 + 0x40))(norm2,c,&destString);
  if (cVar1 == '\0') {
    iVar2 = -1;
  }
  else {
    local_88.p_ = decomposition;
    iVar2 = icu_63::UnicodeString::extract(&destString,&local_88,capacity,pErrorCode);
    local_80 = local_88.p_;
  }
  icu_63::UnicodeString::~UnicodeString(&destString);
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
unorm2_getRawDecomposition(const UNormalizer2 *norm2,
                           UChar32 c, UChar *decomposition, int32_t capacity,
                           UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(decomposition==NULL ? capacity!=0 : capacity<0) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    UnicodeString destString(decomposition, 0, capacity);
    if(reinterpret_cast<const Normalizer2 *>(norm2)->getRawDecomposition(c, destString)) {
        return destString.extract(decomposition, capacity, *pErrorCode);
    } else {
        return -1;
    }
}